

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

bool initSoftHSM(void)

{
  bool bVar1;
  byte bVar2;
  MutexFactory *this;
  SecureMemoryRegistry *pSVar3;
  CryptoFactory *pCVar4;
  Configuration *key;
  string *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  allocator *ifEmpty;
  Configuration *in_stack_ffffffffffffff08;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string local_28 [39];
  bool local_1;
  
  this = MutexFactory::i();
  MutexFactory::disable(this);
  pSVar3 = SecureMemoryRegistry::i();
  if (pSVar3 == (SecureMemoryRegistry *)0x0) {
    fprintf(_stderr,"ERROR: Could not initiate SecureMemoryRegistry.\n");
    local_1 = false;
  }
  else {
    pCVar4 = CryptoFactory::i();
    if (pCVar4 == (CryptoFactory *)0x0) {
      fprintf(_stderr,"ERROR: Could not initiate CryptoFactory.\n");
      local_1 = false;
    }
    else {
      key = Configuration::i();
      SimpleConfigLoader::i();
      bVar1 = Configuration::reload
                        ((Configuration *)
                         CONCAT17(in_stack_fffffffffffffec7,
                                  CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                         (ConfigLoader *)in_stack_fffffffffffffeb8);
      if (bVar1) {
        Configuration::i();
        ifEmpty = &local_49;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"log.level",ifEmpty);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"INFO",&local_81);
        Configuration::getString(in_stack_ffffffffffffff08,(string *)key,(string *)ifEmpty);
        bVar1 = setLogLevel(in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(local_28);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Configuration::i();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"objectstore.backend",&local_c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f0,"file",(allocator *)&stack0xffffffffffffff0f);
          Configuration::getString(in_stack_ffffffffffffff08,(string *)key,(string *)ifEmpty);
          bVar1 = ObjectStoreToken::selectBackend(in_stack_fffffffffffffeb8);
          bVar2 = bVar1 ^ 0xff;
          std::__cxx11::string::~string(local_a8);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          if ((bVar2 & 1) == 0) {
            local_1 = true;
          }
          else {
            fprintf(_stderr,"ERROR: Could not select token backend.\n");
            local_1 = false;
          }
        }
        else {
          fprintf(_stderr,"ERROR: Could not configure the log level.\n");
          local_1 = false;
        }
      }
      else {
        fprintf(_stderr,"ERROR: Could not load the SoftHSM configuration.\n");
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool initSoftHSM()
{
	// Not using threading
	MutexFactory::i()->disable();

	// Initiate SecureMemoryRegistry
	if (SecureMemoryRegistry::i() == NULL)
	{
		fprintf(stderr, "ERROR: Could not initiate SecureMemoryRegistry.\n");
		return false;
	}

	// Build the CryptoFactory
	if (CryptoFactory::i() == NULL)
	{
		fprintf(stderr, "ERROR: Could not initiate CryptoFactory.\n");
		return false;
	}

#ifdef WITH_FIPS
	// Check the FIPS status
	if (!CryptoFactory::i()->getFipsSelfTestStatus())
	{
		fprintf(stderr, "ERROR: FIPS self test failed.\n");
		return false;
	}
#endif

	// Load the configuration
	if (!Configuration::i()->reload(SimpleConfigLoader::i()))
	{
		fprintf(stderr, "ERROR: Could not load the SoftHSM configuration.\n");
		return false;
	}

	// Configure the log level
	if (!setLogLevel(Configuration::i()->getString("log.level", DEFAULT_LOG_LEVEL)))
	{
		fprintf(stderr, "ERROR: Could not configure the log level.\n");
		return false;
	}

	// Configure object store storage backend used by all tokens.
	if (!ObjectStoreToken::selectBackend(Configuration::i()->getString("objectstore.backend", DEFAULT_OBJECTSTORE_BACKEND)))
	{
		fprintf(stderr, "ERROR: Could not select token backend.\n");
		return false;
	}

	return true;
}